

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_filename_journal(char *zFilename)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (zFilename == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    do {
      do {
        pcVar4 = zFilename;
        zFilename = pcVar4 + -1;
      } while (pcVar4[-1] != '\0');
    } while (((pcVar4[-2] != '\0') || (pcVar4[-3] != '\0')) || (pcVar4[-4] != '\0'));
    sVar2 = strlen(pcVar4);
    uVar3 = (ulong)((uint)sVar2 & 0x3fffffff);
    if (pcVar4[uVar3 + 1] == '\0') {
      pcVar4 = pcVar4 + uVar3;
    }
    else {
      pcVar1 = pcVar4 + uVar3 + 1;
      do {
        pcVar4 = pcVar1;
        sVar2 = strlen(pcVar4);
        uVar3 = sVar2 & 0x3fffffff;
        sVar2 = strlen(pcVar4 + uVar3 + 1);
        pcVar1 = pcVar4 + (sVar2 & 0x3fffffff) + uVar3 + 2;
      } while (pcVar4[(sVar2 & 0x3fffffff) + uVar3 + 2] != '\0');
      pcVar4 = pcVar4 + (sVar2 & 0x3fffffff) + uVar3 + 1;
    }
    pcVar4 = pcVar4 + 2;
  }
  return pcVar4;
}

Assistant:

SQLITE_API const char *sqlite3_filename_journal(const char *zFilename){
  if( zFilename==0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename + 1;
}